

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_bmp.c
# Opt level: O1

int bmp_read_1bit(gdImagePtr im,gdIOCtxPtr infile,bmp_info_t *info,bmp_hdr_t *header)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  double dVar8;
  int current_byte;
  int index;
  int local_50;
  uint local_4c;
  int local_48;
  uint local_44;
  ulong local_40;
  gdIOCtxPtr local_38;
  
  local_4c = 0;
  local_50 = 0;
  if (info->enctype == 0) {
    if (info->numcolors == 0) {
      info->numcolors = 2;
    }
    else if (2 < (uint)info->numcolors) {
      return 1;
    }
    iVar2 = bmp_read_palette(im,infile,info->numcolors,(uint)(info->type == 2));
    if (iVar2 == 0) {
      im->colorsTotal = info->numcolors;
      lVar4 = gdTell(infile);
      if (lVar4 != header->off) {
        gdSeek(infile,header->off);
      }
      dVar8 = ceil((double)info->width * 0.1);
      uVar6 = 4 - (int)dVar8 % 4;
      if ((int)dVar8 % 4 == 0) {
        uVar6 = 0;
      }
      local_40 = (ulong)uVar6;
      iVar2 = info->height;
      if (0 < iVar2) {
        local_48 = uVar6 + 1;
        local_44 = 0;
        local_38 = infile;
        do {
          uVar6 = ~local_44 + iVar2;
          if (info->topdown != '\0') {
            uVar6 = local_44;
          }
          if (0 < info->width) {
            iVar2 = 0;
            do {
              iVar3 = gdGetByte(&local_50,infile);
              if (iVar3 == 0) {
                return 1;
              }
              uVar5 = 0;
              do {
                bVar1 = (byte)(local_50 << ((byte)uVar5 & 0x1f)) >> 7;
                local_4c = (uint)bVar1;
                if (im->open[bVar1] != 0) {
                  im->open[bVar1] = 0;
                }
                gdImageSetPixel(im,iVar2 + uVar5,uVar6,local_4c);
              } while (((int)(iVar2 + uVar5) < info->width) &&
                      (bVar7 = uVar5 < 7, uVar5 = uVar5 + 1, bVar7));
              iVar2 = iVar2 + 8;
              infile = local_38;
            } while (iVar2 < info->width);
          }
          iVar2 = local_48;
          if (0 < (int)local_40) {
            do {
              iVar3 = gdGetByte((int *)&local_4c,infile);
              if (iVar3 == 0) {
                return 1;
              }
              iVar2 = iVar2 + -1;
            } while (1 < iVar2);
          }
          local_44 = local_44 + 1;
          iVar2 = info->height;
        } while ((int)local_44 < iVar2);
        return 0;
      }
      return 0;
    }
  }
  return 1;
}

Assistant:

static int bmp_read_1bit(gdImagePtr im, gdIOCtxPtr infile, bmp_info_t *info, bmp_hdr_t *header)
{
	int ypos = 0, xpos = 0, row = 0, index = 0;
	int padding = 0, current_byte = 0, bit = 0;

	if (info->enctype != BMP_BI_RGB) {
		return 1;
	}

	if (!info->numcolors) {
		info->numcolors = 2;
	} else if (info->numcolors < 0 || info->numcolors > 2) {
		return 1;
	}

	if (bmp_read_palette(im, infile, info->numcolors, (info->type == BMP_PALETTE_4))) {
		return 1;
	}

	im->colorsTotal = info->numcolors;

	/* There is a chance the data isn't until later, would be wierd but it is possible */
	if (gdTell(infile) != header->off) {
		/* Should make sure we don't seek past the file size */
		gdSeek(infile, header->off);
	}

	/* The line must be divisible by 4, else its padded with NULLs */
	padding = ((int)ceill(0.1 * info->width)) % 4;
	if (padding) {
		padding = 4 - padding;
	}

	for (ypos = 0; ypos < info->height; ++ypos) {
		if (info->topdown) {
			row = ypos;
		} else {
			row = info->height - ypos - 1;
		}

		for (xpos = 0; xpos < info->width; xpos += 8) {
			/* Bitmaps are always aligned in bytes so we'll never overflow */
			if (!gdGetByte(&current_byte, infile)) {
				return 1;
			}

			for (bit = 0; bit < 8; bit++) {
				index = ((current_byte & (0x80 >> bit)) != 0 ? 0x01 : 0x00);
				if (im->open[index]) {
					im->open[index] = 0;
				}
				gdImageSetPixel(im, xpos + bit, row, index);
				/* No need to read anything extra */
				if ((xpos + bit) >= info->width) {
					break;
				}
			}
		}

		for (xpos = padding; xpos > 0; --xpos) {
			if (!gdGetByte(&index, infile)) {
				return 1;
			}
		}
	}
	return 0;
}